

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
despot::HierarchyCPT::SetParents
          (HierarchyCPT *this,int val,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  NamedVar *child;
  TabularCPT *this_00;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_40;
  
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_40,parents);
  TabularCPT::TabularCPT(this_00,child,&local_40);
  (this->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
  _M_impl.super__Vector_impl_data._M_start[val] = this_00;
  if (local_40.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HierarchyCPT::SetParents(int val, vector<NamedVar*> parents) {
	cpts_[val] = new TabularCPT(child_, parents);
}